

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gru.cpp
# Opt level: O3

int ncnn::gru_int8(Mat *bottom_blob,Mat *top_blob,int reverse,Mat *weight_xc_int8,
                  float *weight_xc_int8_scales,Mat *bias_c,Mat *weight_hc_int8,
                  float *weight_hc_int8_scales,Mat *hidden_state,Option *opt)

{
  float fVar1;
  float fVar2;
  uint _w;
  uint _h;
  uint _h_00;
  size_t sVar3;
  void *pvVar4;
  void *pvVar5;
  undefined4 uVar6;
  undefined1 uVar7;
  undefined1 uVar9;
  undefined1 uVar11;
  undefined1 uVar13;
  undefined4 uVar14;
  undefined1 uVar15;
  undefined1 uVar17;
  undefined1 uVar19;
  undefined1 uVar21;
  undefined4 uVar22;
  undefined1 uVar23;
  undefined1 uVar25;
  undefined1 uVar27;
  undefined1 uVar29;
  undefined8 uVar30;
  int *piVar37;
  long lVar38;
  void *pvVar39;
  void *pvVar40;
  long lVar41;
  long lVar42;
  long lVar43;
  int iVar44;
  ulong uVar45;
  long lVar46;
  int iVar47;
  float *pfVar48;
  uint uVar49;
  long lVar50;
  int iVar51;
  ulong uVar52;
  ulong uVar53;
  long lVar54;
  void *pvVar55;
  void *pvVar56;
  void *pvVar57;
  ulong uVar58;
  uint uVar59;
  void *pvVar60;
  void *pvVar61;
  long lVar62;
  void *pvVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float *bias_c_U;
  float *bias_c_R;
  Option opt_quant;
  Option opt_quant_1;
  ulong local_2d8;
  Mat local_208;
  Mat local_1b8;
  Mat local_168;
  Mat local_118;
  Mat local_c8;
  Option local_78;
  undefined4 uVar8;
  undefined3 uVar10;
  undefined2 uVar12;
  undefined4 uVar16;
  undefined3 uVar18;
  undefined2 uVar20;
  undefined4 uVar24;
  undefined3 uVar26;
  undefined2 uVar28;
  undefined1 uVar31;
  undefined1 uVar32;
  undefined3 uVar33;
  undefined1 uVar34;
  undefined2 uVar35;
  undefined1 uVar36;
  
  _w = bottom_blob->w;
  uVar45 = (ulong)_w;
  _h = bottom_blob->h;
  _h_00 = top_blob->w;
  uVar58 = (ulong)_h_00;
  local_208.cstep = 0;
  local_208.data = (void *)0x0;
  local_208.refcount._0_4_ = 0;
  local_208.refcount._4_4_ = 0;
  local_208.elemsize._0_4_ = 0;
  local_208.elemsize._4_4_ = 0;
  local_208.elempack = 0;
  local_208.allocator = (Allocator *)0x0;
  local_208.dims = 0;
  local_208.w = 0;
  local_208.h = 0;
  local_208.d = 0;
  local_208.c = 0;
  Mat::create(&local_208,2,_h_00,4,opt->workspace_allocator);
  iVar44 = -100;
  if ((local_208.data != (void *)0x0) && ((long)local_208.c * local_208.cstep != 0)) {
    local_118.cstep = 0;
    local_118.data = (void *)0x0;
    local_118.refcount._0_4_ = 0;
    local_118.refcount._4_4_ = 0;
    local_118.elemsize._0_4_ = 0;
    local_118.elemsize._4_4_ = 0;
    local_118.elempack = 0;
    local_118.allocator = (Allocator *)0x0;
    local_118.dims = 0;
    local_118.w = 0;
    local_118.h = 0;
    local_118.d = 0;
    local_118.c = 0;
    Mat::create(&local_118,_w,_h,1,1,opt->workspace_allocator);
    local_c8.cstep = 0;
    local_c8.data = (void *)0x0;
    local_c8.refcount._0_4_ = 0;
    local_c8.refcount._4_4_ = 0;
    local_c8.elemsize._0_4_ = 0;
    local_c8._20_8_ = 0;
    local_c8.allocator = (Allocator *)0x0;
    local_c8.dims = 0;
    local_c8.w = 0;
    local_c8.h = 0;
    local_c8.d = 0;
    local_c8.c = 0;
    Mat::create(&local_c8,_h,4,1,opt->workspace_allocator);
    if (0 < (int)_h) {
      pvVar40 = bottom_blob->data;
      iVar44 = bottom_blob->w;
      sVar3 = bottom_blob->elemsize;
      uVar52 = 0;
      do {
        fVar66 = 0.0;
        if (0 < (int)_w) {
          uVar53 = 0;
          do {
            fVar68 = ABS(*(float *)((long)pvVar40 + uVar53 * 4));
            if (fVar66 <= fVar68) {
              fVar66 = fVar68;
            }
            uVar53 = uVar53 + 1;
          } while (uVar45 != uVar53);
        }
        *(float *)((long)local_c8.data + uVar52 * 4) = 127.0 / fVar66;
        uVar52 = uVar52 + 1;
        pvVar40 = (void *)((long)pvVar40 + (long)iVar44 * sVar3);
      } while (uVar52 != _h);
    }
    local_1b8.data = *(void **)opt;
    uVar6 = opt->openmp_blocktime;
    uVar7 = opt->use_winograd_convolution;
    uVar9 = opt->use_sgemm_convolution;
    uVar11 = opt->use_int8_inference;
    uVar13 = opt->use_vulkan_compute;
    uVar12 = CONCAT11(uVar13,uVar11);
    uVar10 = CONCAT21(uVar12,uVar9);
    uVar8 = CONCAT31(uVar10,uVar7);
    uVar52._0_1_ = opt->use_bf16_storage;
    uVar52._1_1_ = opt->use_fp16_packed;
    uVar52._2_1_ = opt->use_fp16_storage;
    uVar52._3_1_ = opt->use_fp16_arithmetic;
    uVar52._4_1_ = opt->use_int8_packed;
    uVar52._5_1_ = opt->use_int8_storage;
    uVar52._6_1_ = opt->use_int8_arithmetic;
    uVar52._7_1_ = opt->use_packing_layout;
    uVar14 = opt->vulkan_device_index;
    uVar15 = opt->use_reserved_1;
    uVar17 = opt->use_image_storage;
    uVar19 = opt->use_tensor_storage;
    uVar21 = opt->use_reserved_2;
    uVar20 = CONCAT11(uVar21,uVar19);
    uVar18 = CONCAT21(uVar20,uVar17);
    uVar16 = CONCAT31(uVar18,uVar15);
    uVar22 = opt->flush_denormals;
    uVar23 = opt->use_local_pool_allocator;
    uVar25 = opt->use_shader_local_memory;
    uVar27 = opt->use_cooperative_matrix;
    uVar29 = opt->use_winograd23_convolution;
    uVar28 = CONCAT11(uVar29,uVar27);
    uVar26 = CONCAT21(uVar28,uVar25);
    uVar24 = CONCAT31(uVar26,uVar23);
    uVar30._0_1_ = opt->use_winograd43_convolution;
    uVar30._1_1_ = opt->use_winograd63_convolution;
    uVar30._2_1_ = opt->use_a53_a55_optimized_kernel;
    uVar30._3_1_ = opt->use_fp16_uniform;
    uVar31 = opt->use_int8_uniform;
    uVar32 = opt->use_reserved_9;
    uVar34 = opt->use_reserved_10;
    uVar36 = opt->use_reserved_11;
    uVar35 = CONCAT11(uVar36,uVar34);
    uVar33 = CONCAT21(uVar35,uVar32);
    uVar30._4_4_ = CONCAT31(uVar33,uVar31);
    local_1b8.c = (int)uVar30;
    local_1b8.elemsize._0_4_ = SUB84(opt->workspace_allocator,0);
    local_1b8.elemsize._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    local_1b8.refcount._0_4_ = SUB84(opt->workspace_allocator,0);
    local_1b8.refcount._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    local_1b8.allocator = (Allocator *)(uVar52 & 0xffffffffffffff);
    local_1b8.elempack = uVar6;
    local_1b8._28_4_ = uVar8;
    local_1b8.dims = uVar14;
    local_1b8.w = uVar16;
    local_1b8.h = uVar22;
    local_1b8.d = uVar24;
    local_1b8._60_4_ = uVar30._4_4_;
    quantize_to_int8(bottom_blob,&local_118,&local_c8,(Option *)&local_1b8);
    local_1b8.cstep = 0;
    local_1b8.data = (void *)0x0;
    local_1b8.refcount._0_4_ = 0;
    local_1b8.refcount._4_4_ = 0;
    local_1b8.elemsize._0_4_ = 0;
    local_1b8.elemsize._4_4_ = 0;
    local_1b8.elempack = 0;
    local_1b8.allocator = (Allocator *)0x0;
    local_1b8.dims = 0;
    local_1b8.w = 0;
    local_1b8.h = 0;
    local_1b8.d = 0;
    local_1b8.c = 0;
    Mat::create(&local_1b8,_h_00,1,1,opt->workspace_allocator);
    local_168.cstep = 0;
    local_168.data = (float *)0x0;
    local_168.refcount._0_4_ = 0;
    local_168.refcount._4_4_ = 0;
    local_168.elemsize._0_4_ = 0;
    local_168._20_8_ = 0;
    local_168.allocator = (Allocator *)0x0;
    local_168.dims = 0;
    local_168.w = 0;
    local_168.h = 0;
    local_168.d = 0;
    local_168.c = 0;
    Mat::create(&local_168,1,4,1,opt->workspace_allocator);
    if (0 < (int)_h) {
      uVar52 = (ulong)(_h_00 * 2);
      uVar59 = 0;
      do {
        uVar49 = ~uVar59 + _h;
        if (reverse == 0) {
          uVar49 = uVar59;
        }
        if ((int)_h_00 < 1) {
LAB_005130e6:
          *(float *)local_168.data = 1.0;
          if (0 < local_1b8.c * (int)local_1b8.cstep) {
            memset(local_1b8.data,0,(ulong)(uint)(local_1b8.c * (int)local_1b8.cstep));
          }
        }
        else {
          fVar66 = 0.0;
          uVar53 = 0;
          do {
            fVar68 = ABS(*(float *)((long)hidden_state->data + uVar53 * 4));
            if (fVar66 <= fVar68) {
              fVar66 = fVar68;
            }
            uVar53 = uVar53 + 1;
          } while (uVar58 != uVar53);
          if (fVar66 == 0.0) goto LAB_005130e6;
          *(float *)local_168.data = 127.0 / fVar66;
          local_78.lightmode = opt->lightmode;
          local_78.use_shader_pack8 = opt->use_shader_pack8;
          local_78.use_subgroup_ops = opt->use_subgroup_ops;
          local_78.use_reserved_0 = opt->use_reserved_0;
          local_78.num_threads = opt->num_threads;
          local_78.workspace_allocator = opt->workspace_allocator;
          local_78.openmp_blocktime = opt->openmp_blocktime;
          local_78.use_winograd_convolution = opt->use_winograd_convolution;
          local_78.use_sgemm_convolution = opt->use_sgemm_convolution;
          local_78.use_int8_inference = opt->use_int8_inference;
          local_78.use_vulkan_compute = opt->use_vulkan_compute;
          uVar53._0_1_ = opt->use_bf16_storage;
          uVar53._1_1_ = opt->use_fp16_packed;
          uVar53._2_1_ = opt->use_fp16_storage;
          uVar53._3_1_ = opt->use_fp16_arithmetic;
          uVar53._4_1_ = opt->use_int8_packed;
          uVar53._5_1_ = opt->use_int8_storage;
          uVar53._6_1_ = opt->use_int8_arithmetic;
          uVar53._7_1_ = opt->use_packing_layout;
          local_78.vulkan_device_index = opt->vulkan_device_index;
          local_78.use_reserved_1 = opt->use_reserved_1;
          local_78.use_image_storage = opt->use_image_storage;
          local_78.use_tensor_storage = opt->use_tensor_storage;
          local_78.use_reserved_2 = opt->use_reserved_2;
          local_78.flush_denormals = opt->flush_denormals;
          local_78.use_local_pool_allocator = opt->use_local_pool_allocator;
          local_78.use_shader_local_memory = opt->use_shader_local_memory;
          local_78.use_cooperative_matrix = opt->use_cooperative_matrix;
          local_78.use_winograd23_convolution = opt->use_winograd23_convolution;
          local_78.use_winograd43_convolution = opt->use_winograd43_convolution;
          local_78.use_winograd63_convolution = opt->use_winograd63_convolution;
          local_78.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
          local_78.use_fp16_uniform = opt->use_fp16_uniform;
          local_78.use_int8_uniform = opt->use_int8_uniform;
          local_78.use_reserved_9 = opt->use_reserved_9;
          local_78.use_reserved_10 = opt->use_reserved_10;
          local_78.use_reserved_11 = opt->use_reserved_11;
          local_78.blob_allocator = opt->workspace_allocator;
          local_78._32_8_ = uVar53 & 0xffffffffffffff;
          quantize_to_int8(hidden_state,&local_1b8,&local_168,&local_78);
        }
        pvVar39 = local_118.data;
        pvVar5 = local_1b8.data;
        pvVar40 = local_208.data;
        if (0 < (int)_h_00) {
          lVar46 = (long)(int)uVar49;
          lVar50 = local_118.w * lVar46 *
                   CONCAT44(local_118.elemsize._4_4_,(undefined4)local_118.elemsize);
          fVar68 = 1.0 / *(float *)((long)local_c8.data + lVar46 * 4);
          fVar66 = 1.0 / *local_168.data;
          lVar41 = (long)local_208.w;
          lVar38 = CONCAT44(local_208.elemsize._4_4_,(undefined4)local_208.elemsize);
          lVar42 = (long)bias_c->w * bias_c->elemsize;
          pvVar4 = bias_c->data;
          pvVar55 = weight_xc_int8->data;
          pvVar61 = weight_hc_int8->data;
          lVar54 = (long)weight_xc_int8->w * weight_xc_int8->elemsize;
          pvVar56 = (void *)(lVar54 * uVar58 + (long)pvVar55);
          lVar62 = (long)weight_hc_int8->w * weight_hc_int8->elemsize;
          pvVar60 = (void *)(lVar62 * uVar58 + (long)pvVar61);
          pvVar63 = (void *)(lVar62 * uVar52 + (long)pvVar61);
          pvVar57 = (void *)(lVar54 * uVar52 + (long)pvVar55);
          local_2d8 = 0;
          do {
            if ((int)_w < 1) {
              fVar64 = 0.0;
              fVar67 = 0.0;
            }
            else {
              uVar53 = 0;
              iVar44 = 0;
              iVar47 = 0;
              do {
                iVar51 = (int)*(char *)((long)pvVar39 + uVar53 + lVar50);
                iVar44 = iVar44 + *(char *)((long)pvVar55 + uVar53) * iVar51;
                iVar47 = iVar47 + *(char *)((long)pvVar56 + uVar53) * iVar51;
                uVar53 = uVar53 + 1;
              } while (uVar45 != uVar53);
              fVar67 = (float)iVar44;
              fVar64 = (float)iVar47;
            }
            lVar43 = lVar41 * lVar38 * local_2d8;
            fVar65 = weight_xc_int8_scales[local_2d8 + uVar58];
            fVar1 = weight_hc_int8_scales[local_2d8 + uVar58];
            uVar53 = 0;
            iVar47 = 0;
            iVar44 = 0;
            do {
              iVar51 = (int)*(char *)((long)pvVar5 + uVar53);
              iVar47 = iVar47 + *(char *)((long)pvVar61 + uVar53) * iVar51;
              iVar44 = iVar44 + *(char *)((long)pvVar60 + uVar53) * iVar51;
              uVar53 = uVar53 + 1;
            } while (uVar58 != uVar53);
            fVar2 = *(float *)((long)pvVar4 + local_2d8 * 4 + lVar42);
            fVar67 = expf(-(((float)iVar47 * fVar66) / weight_hc_int8_scales[local_2d8] +
                            (fVar67 * fVar68) / weight_xc_int8_scales[local_2d8] +
                           *(float *)((long)pvVar4 + local_2d8 * 4)));
            fVar64 = expf(-(((float)iVar44 * fVar66) / fVar1 + (fVar64 * fVar68) / fVar65 + fVar2));
            uVar53 = 0;
            iVar44 = 0;
            do {
              iVar44 = iVar44 + (int)*(char *)((long)pvVar63 + uVar53) *
                                (int)*(char *)((long)pvVar5 + uVar53);
              uVar53 = uVar53 + 1;
            } while (uVar58 != uVar53);
            if ((int)_w < 1) {
              fVar65 = 0.0;
            }
            else {
              uVar53 = 0;
              iVar47 = 0;
              do {
                iVar47 = iVar47 + (int)*(char *)((long)pvVar57 + uVar53) *
                                  (int)*(char *)((long)pvVar39 + uVar53 + lVar50);
                uVar53 = uVar53 + 1;
              } while (uVar45 != uVar53);
              fVar65 = (float)iVar47;
            }
            fVar67 = tanhf((fVar65 * fVar68) / weight_xc_int8_scales[uVar52 + local_2d8] +
                           *(float *)((long)pvVar4 + local_2d8 * 4 + lVar42 * 2) +
                           (((float)iVar44 * fVar66) / weight_hc_int8_scales[uVar52 + local_2d8] +
                           *(float *)((long)pvVar4 + local_2d8 * 4 + lVar42 * 3)) / (fVar67 + 1.0));
            *(float *)((long)pvVar40 + lVar43) = 1.0 / (fVar64 + 1.0);
            *(float *)((long)pvVar40 + lVar43 + 4) = fVar67;
            local_2d8 = local_2d8 + 1;
            pvVar56 = (void *)((long)pvVar56 + lVar54);
            pvVar55 = (void *)((long)pvVar55 + lVar54);
            pvVar60 = (void *)((long)pvVar60 + lVar62);
            pvVar61 = (void *)((long)pvVar61 + lVar62);
            pvVar63 = (void *)((long)pvVar63 + lVar62);
            pvVar57 = (void *)((long)pvVar57 + lVar54);
          } while (local_2d8 != uVar58);
          if (0 < (int)_h_00) {
            iVar44 = top_blob->w;
            sVar3 = top_blob->elemsize;
            pvVar40 = top_blob->data;
            pvVar5 = hidden_state->data;
            pfVar48 = (float *)((long)local_208.data + 4);
            uVar53 = 0;
            do {
              fVar66 = (*(float *)((long)pvVar5 + uVar53 * 4) - *pfVar48) * pfVar48[-1] + *pfVar48;
              *(float *)((long)pvVar5 + uVar53 * 4) = fVar66;
              *(float *)((long)pvVar40 + uVar53 * 4 + iVar44 * lVar46 * sVar3) = fVar66;
              uVar53 = uVar53 + 1;
              pfVar48 = (float *)((long)pfVar48 +
                                 (long)local_208.w *
                                 CONCAT44(local_208.elemsize._4_4_,(undefined4)local_208.elemsize));
            } while (uVar58 != uVar53);
          }
        }
        uVar59 = uVar59 + 1;
      } while (uVar59 != _h);
    }
    piVar37 = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
    if (piVar37 != (int *)0x0) {
      LOCK();
      *piVar37 = *piVar37 + -1;
      UNLOCK();
      if (*piVar37 == 0) {
        if (local_168.allocator == (Allocator *)0x0) {
          if ((float *)local_168.data != (float *)0x0) {
            free(local_168.data);
          }
        }
        else {
          (*(local_168.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar37 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
    if (piVar37 != (int *)0x0) {
      LOCK();
      *piVar37 = *piVar37 + -1;
      UNLOCK();
      if (*piVar37 == 0) {
        if (local_1b8.allocator == (Allocator *)0x0) {
          if (local_1b8.data != (void *)0x0) {
            free(local_1b8.data);
          }
        }
        else {
          (*(local_1b8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar37 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
    if (piVar37 != (int *)0x0) {
      LOCK();
      *piVar37 = *piVar37 + -1;
      UNLOCK();
      if (*piVar37 == 0) {
        if (local_c8.allocator == (Allocator *)0x0) {
          if (local_c8.data != (void *)0x0) {
            free(local_c8.data);
          }
        }
        else {
          (*(local_c8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar37 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
    if (piVar37 != (int *)0x0) {
      LOCK();
      *piVar37 = *piVar37 + -1;
      UNLOCK();
      if (*piVar37 == 0) {
        if (local_118.allocator == (Allocator *)0x0) {
          if (local_118.data != (void *)0x0) {
            free(local_118.data);
          }
        }
        else {
          (*(local_118.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    iVar44 = 0;
  }
  piVar37 = (int *)CONCAT44(local_208.refcount._4_4_,local_208.refcount._0_4_);
  if (piVar37 != (int *)0x0) {
    LOCK();
    *piVar37 = *piVar37 + -1;
    UNLOCK();
    if (*piVar37 == 0) {
      if (local_208.allocator == (Allocator *)0x0) {
        if (local_208.data != (void *)0x0) {
          free(local_208.data);
        }
      }
      else {
        (*(local_208.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar44;
}

Assistant:

static int gru_int8(const Mat& bottom_blob, Mat& top_blob, int reverse, const Mat& weight_xc_int8, const float* weight_xc_int8_scales, const Mat& bias_c, const Mat& weight_hc_int8, const float* weight_hc_int8_scales, Mat& hidden_state, const Option& opt)
{
    int size = bottom_blob.w;
    int T = bottom_blob.h;

    int num_output = top_blob.w;

    // 2 x num_output
    Mat gates(2, num_output, 4u, opt.workspace_allocator);
    if (gates.empty())
        return -100;

    // dynamic quantize bottom_blob
    Mat bottom_blob_int8(size, T, (size_t)1u, 1, opt.workspace_allocator);
    Mat bottom_blob_int8_scales(T, (size_t)4u, 1, opt.workspace_allocator);
    {
        for (int t = 0; t < T; t++)
        {
            const float* x = bottom_blob.row(t);

            float absmax = 0.f;
            for (int i = 0; i < size; i++)
            {
                absmax = std::max(absmax, (float)fabs(x[i]));
            }

            bottom_blob_int8_scales[t] = 127.f / absmax;
        }

        Option opt_quant = opt;
        opt_quant.blob_allocator = opt.workspace_allocator;
        opt_quant.use_packing_layout = false;
        quantize_to_int8(bottom_blob, bottom_blob_int8, bottom_blob_int8_scales, opt_quant);
    }

    Mat hidden_state_int8(num_output, (size_t)1u, 1, opt.workspace_allocator);
    Mat hidden_state_int8_scales(1, (size_t)4u, 1, opt.workspace_allocator);

    // unroll
    for (int t = 0; t < T; t++)
    {
        int ti = reverse ? T - 1 - t : t;

        // dynamic quantize hidden_state
        {
            float absmax = 0.f;
            for (int i = 0; i < num_output; i++)
            {
                absmax = std::max(absmax, (float)fabs(hidden_state[i]));
            }

            if (absmax == 0.f)
            {
                hidden_state_int8_scales[0] = 1.f;
                hidden_state_int8.fill<signed char>(0);
            }
            else
            {
                hidden_state_int8_scales[0] = 127.f / absmax;

                Option opt_quant = opt;
                opt_quant.blob_allocator = opt.workspace_allocator;
                opt_quant.use_packing_layout = false;
                quantize_to_int8(hidden_state, hidden_state_int8, hidden_state_int8_scales, opt_quant);
            }
        }

        const signed char* x = bottom_blob_int8.row<const signed char>(ti);
        const signed char* hs = hidden_state_int8;
        const float descale_x = 1.f / bottom_blob_int8_scales[ti];
        const float descale_h = 1.f / hidden_state_int8_scales[0];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < num_output; q++)
        {
            float* gates_data = gates.row(q);

            // gate reset update
            const float* bias_c_R = bias_c.row(0);
            const float* bias_c_U = bias_c.row(1);

            const signed char* weight_xc_int8_R = weight_xc_int8.row<const signed char>(num_output * 0 + q);
            const signed char* weight_xc_int8_U = weight_xc_int8.row<const signed char>(num_output * 1 + q);
            const signed char* weight_hc_int8_R = weight_hc_int8.row<const signed char>(num_output * 0 + q);
            const signed char* weight_hc_int8_U = weight_hc_int8.row<const signed char>(num_output * 1 + q);

            const float descale_xc_R = 1.f / weight_xc_int8_scales[num_output * 0 + q];
            const float descale_xc_U = 1.f / weight_xc_int8_scales[num_output * 1 + q];
            const float descale_hc_R = 1.f / weight_hc_int8_scales[num_output * 0 + q];
            const float descale_hc_U = 1.f / weight_hc_int8_scales[num_output * 1 + q];

            int Rx = 0;
            int Ux = 0;
            for (int i = 0; i < size; i++)
            {
                signed char xi = x[i];

                Rx += weight_xc_int8_R[i] * xi;
                Ux += weight_xc_int8_U[i] * xi;
            }

            int Rh = 0;
            int Uh = 0;
            for (int i = 0; i < num_output; i++)
            {
                signed char h_cont = hs[i];

                Rh += weight_hc_int8_R[i] * h_cont;
                Uh += weight_hc_int8_U[i] * h_cont;
            }

            float R = bias_c_R[q] + Rx * (descale_x * descale_xc_R) + Rh * (descale_h * descale_hc_R);
            float U = bias_c_U[q] + Ux * (descale_x * descale_xc_U) + Uh * (descale_h * descale_hc_U);

            // sigmoid(R)
            // sigmoid(U)
            R = 1.f / (1.f + expf(-R));
            U = 1.f / (1.f + expf(-U));

            // gate new
            const float* bias_c_WN = bias_c.row(2);
            const float* bias_c_BN = bias_c.row(3);

            const signed char* weight_xc_int8_N = weight_xc_int8.row<const signed char>(num_output * 2 + q);
            const signed char* weight_hc_int8_N = weight_hc_int8.row<const signed char>(num_output * 2 + q);

            const float descale_xc_N = 1.f / weight_xc_int8_scales[num_output * 2 + q];
            const float descale_hc_N = 1.f / weight_hc_int8_scales[num_output * 2 + q];

            int Nh = 0;
            for (int i = 0; i < num_output; i++)
            {
                signed char h_cont = hs[i];

                Nh += weight_hc_int8_N[i] * h_cont;
            }

            int Nx = 0;
            for (int i = 0; i < size; i++)
            {
                signed char xi = x[i];

                Nx += weight_xc_int8_N[i] * xi;
            }

            float N = bias_c_BN[q] + Nh * (descale_h * descale_hc_N);
            N = bias_c_WN[q] + R * N + Nx * (descale_x * descale_xc_N);

            // tanh(N)
            N = tanhf(N);

            gates_data[0] = U;
            gates_data[1] = N;
        }

        // h_t := (1 - update) .* new + update .* h_{t-1}
        float* output_data = top_blob.row(ti);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < num_output; q++)
        {
            const float* gates_data = gates.row(q);

            float U = gates_data[0];
            float N = gates_data[1];

            float H = (1 - U) * N + U * hidden_state[q];

            hidden_state[q] = H;
            output_data[q] = H;
        }
    }

    return 0;
}